

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock_linux-inl.h
# Opt level: O3

void base::internal::SpinLockDelay(atomic<int> *w,int32_t value,int loop)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  timespec local_40;
  
  if (loop != 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    local_40.tv_sec = 0;
    if (have_futex == true) {
      SuggestedDelayNS(int)::rand = SuggestedDelayNS(int)::rand * 0x5deece66d + 0xb;
      uVar3 = 0x20;
      if ((uint)loop < 0x20) {
        uVar3 = loop;
      }
      local_40.tv_nsec =
           ((ulong)(SuggestedDelayNS(int)::rand * 0x10000) >> (0x2cU - (char)(uVar3 >> 3) & 0x3f))
           << 4;
      syscall(0xca,w,(ulong)((futex_private_flag ^ 1) << 7),(ulong)(uint)value,&local_40,0,0);
    }
    else {
      local_40.tv_nsec = 0x1e8481;
      nanosleep(&local_40,(timespec *)0x0);
    }
    *piVar2 = iVar1;
  }
  return;
}

Assistant:

void SpinLockDelay(std::atomic<int> *w, int32_t value, int loop) {
  if (loop != 0) {
    int save_errno = errno;
    struct timespec tm;
    tm.tv_sec = 0;
    if (have_futex) {
      tm.tv_nsec = base::internal::SuggestedDelayNS(loop);
    } else {
      tm.tv_nsec = 2000001;   // above 2ms so linux 2.4 doesn't spin
    }
    if (have_futex) {
      tm.tv_nsec *= 16;  // increase the delay; we expect explicit wakeups
      syscall(__NR_futex, reinterpret_cast<int*>(w),
              FUTEX_WAIT | futex_private_flag, value,
              reinterpret_cast<struct kernel_timespec*>(&tm), nullptr, 0);
    } else {
      nanosleep(&tm, nullptr);
    }
    errno = save_errno;
  }
}